

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O2

cmCommand * __thiscall cmFunctionHelperCommand::Clone(cmFunctionHelperCommand *this)

{
  _WordT _Var1;
  _WordT _Var2;
  _WordT _Var3;
  cmFunctionHelperCommand *this_00;
  
  this_00 = (cmFunctionHelperCommand *)operator_new(200);
  cmFunctionHelperCommand(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this_00->Args,&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            (&this_00->Functions,&this->Functions);
  _Var1 = (this->Policies).Status.super__Base_bitset<5UL>._M_w[1];
  _Var2 = (this->Policies).Status.super__Base_bitset<5UL>._M_w[2];
  _Var3 = (this->Policies).Status.super__Base_bitset<5UL>._M_w[3];
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[0] =
       (this->Policies).Status.super__Base_bitset<5UL>._M_w[0];
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[1] = _Var1;
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[2] = _Var2;
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[3] = _Var3;
  (this_00->Policies).Status.super__Base_bitset<5UL>._M_w[4] =
       (this->Policies).Status.super__Base_bitset<5UL>._M_w[4];
  std::__cxx11::string::_M_assign((string *)&this_00->FilePath);
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
  {
    cmFunctionHelperCommand *newC = new cmFunctionHelperCommand;
    // we must copy when we clone
    newC->Args = this->Args;
    newC->Functions = this->Functions;
    newC->Policies = this->Policies;
    newC->FilePath = this->FilePath;
    return newC;
  }